

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

DirectionalLight *
embree::SceneGraph::DirectionalLight::lerp
          (DirectionalLight *__return_storage_ptr__,DirectionalLight *light0,
          DirectionalLight *light1,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar17 = 1.0 - f;
  fVar1 = (light1->D).field_0.m128[0];
  fVar2 = (light1->D).field_0.m128[1];
  fVar3 = (light1->D).field_0.m128[2];
  fVar4 = (light1->D).field_0.m128[3];
  fVar5 = (light0->D).field_0.m128[0];
  fVar6 = (light0->D).field_0.m128[1];
  fVar7 = (light0->D).field_0.m128[2];
  fVar8 = (light0->D).field_0.m128[3];
  fVar9 = (light1->E).field_0.m128[0];
  fVar10 = (light1->E).field_0.m128[1];
  fVar11 = (light1->E).field_0.m128[2];
  fVar12 = (light1->E).field_0.m128[3];
  fVar13 = (light0->E).field_0.m128[0];
  fVar14 = (light0->E).field_0.m128[1];
  fVar15 = (light0->E).field_0.m128[2];
  fVar16 = (light0->E).field_0.m128[3];
  (__return_storage_ptr__->super_Light).type = LIGHT_DIRECTIONAL;
  (__return_storage_ptr__->D).field_0.m128[0] = fVar5 * fVar17 + fVar1 * f;
  (__return_storage_ptr__->D).field_0.m128[1] = fVar6 * fVar17 + fVar2 * f;
  (__return_storage_ptr__->D).field_0.m128[2] = fVar7 * fVar17 + fVar3 * f;
  (__return_storage_ptr__->D).field_0.m128[3] = fVar8 * fVar17 + fVar4 * f;
  (__return_storage_ptr__->E).field_0.m128[0] = fVar17 * fVar13 + f * fVar9;
  (__return_storage_ptr__->E).field_0.m128[1] = fVar17 * fVar14 + f * fVar10;
  (__return_storage_ptr__->E).field_0.m128[2] = fVar17 * fVar15 + f * fVar11;
  (__return_storage_ptr__->E).field_0.m128[3] = fVar17 * fVar16 + f * fVar12;
  return __return_storage_ptr__;
}

Assistant:

static DirectionalLight lerp(const DirectionalLight& light0, const DirectionalLight& light1, const float f)
      {
        return DirectionalLight(embree::lerp(light0.D,light1.D,f),
                                embree::lerp(light0.E,light1.E,f));
      }